

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O0

void convolve_no_maxpool_padding_zero
               (float **input,int in_width,int in_height,int in_stride,
               CNN_LAYER_CONFIG *layer_config,float **output,int out_stride,int start_idx,int cstep,
               int filter_width_half,int filter_height_half,int ii_shift,int jj_shift,
               int channel_step)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int *in_R8;
  long in_R9;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int jj;
  int ii;
  int off;
  int k;
  float sum;
  int end_jj;
  int start_jj;
  int right_cstep;
  int left_cstep;
  int out_index;
  int w;
  int end_ii;
  int start_ii;
  int top_cstep;
  int out_h;
  int u;
  int h;
  int i;
  int right_filter_margin;
  int top_filter_margin;
  int end_jj_shift;
  int end_ii_shift;
  int start_w;
  int start_h;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  float local_78;
  int local_64;
  int local_60;
  int local_4c;
  int local_48;
  int local_44;
  
  iVar2 = get_start_shift_convolve(in_EDX,in_R8[2],in_R8[5]);
  iVar3 = get_start_shift_convolve(in_ESI,in_R8[1],in_R8[4]);
  iVar4 = jj + 1;
  iVar1 = in_R8[1];
  for (local_44 = in_stack_00000010; local_44 < in_R8[3]; local_44 = left_cstep + local_44) {
    local_4c = 0;
    for (local_48 = iVar2; local_48 < in_EDX; local_48 = in_R8[5] + local_48) {
      local_64 = local_4c * in_stack_00000008;
      if (iVar1 * (int)sum - local_48 * in_R8[1] < 0) {
        local_8c = 0;
      }
      else {
        local_8c = iVar1 * (int)sum - local_48 * in_R8[1];
      }
      if (local_48 - (int)sum < 0) {
        local_90 = 0;
      }
      else {
        local_90 = local_48 - (int)sum;
      }
      local_60 = iVar3;
      local_94 = in_EDX;
      if (local_48 + off + 1 <= in_EDX) {
        local_94 = local_48 + off + 1;
      }
      for (; local_60 < in_ESI; local_60 = in_R8[4] + local_60) {
        if (start_jj - local_60 < 0) {
          local_98 = 0;
        }
        else {
          local_98 = start_jj - local_60;
        }
        if ((iVar4 - in_ESI) + local_60 < 0) {
          local_9c = 0;
        }
        else {
          local_9c = (iVar4 - in_ESI) + local_60;
        }
        if (local_60 - start_jj < 0) {
          local_a0 = 0;
        }
        else {
          local_a0 = local_60 - start_jj;
        }
        local_a4 = in_ESI;
        if (local_60 + iVar4 <= in_ESI) {
          local_a4 = local_60 + iVar4;
        }
        local_78 = *(float *)(*(long *)(in_R8 + 10) + (long)local_44 * 4);
        for (local_7c = 0; local_7c < *in_R8; local_7c = local_7c + 1) {
          local_80 = local_7c * in_R8[3] + local_8c * in_stack_00000018 + local_44;
          for (local_84 = local_90; local_84 < local_94; local_84 = local_84 + 1) {
            local_80 = local_98 * in_stack_00000018 + local_80;
            for (local_88 = local_a0; local_88 < local_a4; local_88 = local_88 + 1) {
              local_78 = *(float *)(*(long *)(in_R8 + 8) + (long)local_80 * 4) *
                         *(float *)(*(long *)(in_RDI + (long)local_7c * 8) +
                                   (long)(local_84 * in_ECX + local_88) * 4) + local_78;
              local_80 = in_stack_00000018 + local_80;
            }
            local_80 = local_9c * in_stack_00000018 + local_80;
          }
        }
        *(float *)(*(long *)(in_R9 + (long)local_44 * 8) + (long)local_64 * 4) = local_78;
        local_64 = local_64 + 1;
      }
      local_4c = local_4c + 1;
    }
  }
  return;
}

Assistant:

static void convolve_no_maxpool_padding_zero(
    const float **input, int in_width, int in_height, int in_stride,
    const CNN_LAYER_CONFIG *const layer_config, float **output, int out_stride,
    int start_idx, const int cstep, const int filter_width_half,
    const int filter_height_half, const int ii_shift, const int jj_shift,
    const int channel_step) {
  const int start_h = get_start_shift_convolve(
      in_height, layer_config->filter_height, layer_config->skip_height);
  const int start_w = get_start_shift_convolve(
      in_width, layer_config->filter_width, layer_config->skip_width);
  const int end_ii_shift = filter_height_half + 1;
  const int end_jj_shift = filter_width_half + 1;
  // *_filter_margin stores the number of pixels along a dimension in the
  // intersection of the complement of the image in the extended image
  // and the filter.
  const int top_filter_margin = layer_config->filter_width * ii_shift;
  const int right_filter_margin = end_jj_shift - in_width;
  for (int i = start_idx; i < layer_config->out_channels; i += channel_step) {
    for (int h = start_h, u = 0; h < in_height;
         h += layer_config->skip_height, ++u) {
      const int out_h = u * out_stride;
      const int top_cstep =
          AOMMAX(0, top_filter_margin - h * layer_config->filter_width) *
              cstep +
          i;
      const int start_ii = AOMMAX(0, h - ii_shift);
      const int end_ii = AOMMIN(in_height, h + end_ii_shift);
      for (int w = start_w, out_index = out_h; w < in_width;
           w += layer_config->skip_width, ++out_index) {
        const int left_cstep = AOMMAX(0, jj_shift - w) * cstep;
        const int right_cstep = AOMMAX(0, right_filter_margin + w) * cstep;
        const int start_jj = AOMMAX(0, w - jj_shift);
        const int end_jj = AOMMIN(in_width, w + end_jj_shift);
        float sum = layer_config->bias[i];
        for (int k = 0; k < layer_config->in_channels; ++k) {
          int off = k * layer_config->out_channels + top_cstep;
          for (int ii = start_ii; ii < end_ii; ++ii) {
            off += left_cstep;
            for (int jj = start_jj; jj < end_jj; ++jj, off += cstep) {
              sum += layer_config->weights[off] * input[k][ii * in_stride + jj];
            }
            off += right_cstep;
          }
        }
        output[i][out_index] = sum;
      }
    }
  }
}